

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools.hpp
# Opt level: O3

bool Diligent::StreqSuff(char *RefStr,char *Str,char *Suff,bool NoSuffixAllowed)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  undefined7 in_register_00000009;
  bool bVar4;
  string msg;
  string local_48;
  
  if (RefStr == (char *)0x0 || Str == (char *)0x0) {
    FormatString<char[26],char[36]>
              (&local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"RefStr != nullptr && Str != nullptr",
               (char (*) [36])CONCAT71(in_register_00000009,Str != (char *)0x0));
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"StreqSuff",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/StringTools.hpp"
               ,0x76);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if (RefStr == (char *)0x0) {
      return false;
    }
  }
  cVar2 = *RefStr;
  do {
    if (cVar2 == '\0') {
      bVar4 = *Str == '\0';
      bVar1 = true;
      if (bVar4 && !NoSuffixAllowed) {
LAB_0022827e:
        bVar4 = bVar1;
        if (Suff != (char *)0x0) {
          iVar3 = strcmp(RefStr,Suff);
          bVar4 = iVar3 == 0;
        }
      }
      return bVar4;
    }
    if (*Str == '\0') {
      bVar1 = false;
      goto LAB_0022827e;
    }
    if (cVar2 != *Str) {
      return false;
    }
    Str = Str + 1;
    cVar2 = RefStr[1];
    RefStr = RefStr + 1;
  } while( true );
}

Assistant:

inline bool StreqSuff(const char* RefStr, const char* Str, const char* Suff, bool NoSuffixAllowed = false)
{
    VERIFY_EXPR(RefStr != nullptr && Str != nullptr);
    if (RefStr == nullptr)
        return false;

    const auto* r = RefStr;
    const auto* s = Str;
    // abc_def     abc
    // ^           ^
    // r           s
    for (; *r != 0 && *s != 0; ++r, ++s)
    {
        if (*r != *s)
        {
            // abc_def     abx
            //   ^           ^
            //   r           s
            return false;
        }
    }

    if (*s != 0)
    {
        // ab         abc
        //   ^          ^
        //   r          s
        VERIFY_EXPR(*r == 0);
        return false;
    }
    else
    {
        // abc_def     abc
        //    ^           ^
        //    r           s

        if (NoSuffixAllowed && *r == 0)
        {
            // abc         abc      _def
            //    ^           ^
            //    r           s
            return true;
        }

        if (Suff != nullptr)
        {
            // abc_def     abc       _def
            //    ^           ^      ^
            //    r           s      Suff
            return strcmp(r, Suff) == 0;
        }
        else
        {
            // abc         abc                abc_def         abc
            //    ^           ^       or         ^               ^
            //    r           s                  r               s
            return *r == 0;
        }
    }
}